

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics.cpp
# Opt level: O0

ostream * operator<<(ostream *os,total_game_stats_t *s)

{
  ostream *poVar1;
  total_game_stats_t *s_local;
  ostream *os_local;
  
  poVar1 = (ostream *)std::ostream::operator<<(os,s->bestScore);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,s->gameCount);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,s->winCount);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,s->totalMoveCount);
  poVar1 = std::operator<<(poVar1,"\n");
  std::ostream::operator<<(poVar1,s->totalDuration);
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os, total_game_stats_t &s) {
  os << s.bestScore << "\n"
     << s.gameCount << "\n"
     << s.winCount << "\n"
     << s.totalMoveCount << "\n"
     << s.totalDuration;
  return os;
}